

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O3

uint __thiscall
FMB::FiniteModelMultiSorted::evaluateGroundTerm(FiniteModelMultiSorted *this,Term *term)

{
  uint uVar1;
  uint uVar2;
  Entry *pEVar3;
  uint *__s;
  OperatorType *pOVar5;
  TermList TVar6;
  ulong uVar7;
  undefined8 *puVar8;
  uint *res;
  uint *puVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  DArray<unsigned_int> args;
  string local_88;
  ulong local_68;
  ulong local_60;
  uint *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  pair<unsigned_int,_unsigned_int> pVar4;
  
  local_88._M_dataplus._M_p = (pointer)term;
  pEVar3 = Lib::
           DHMap<Kernel::Term_*,_std::pair<unsigned_int,_unsigned_int>,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry(&this->_domainConstantsRev,(Term **)&local_88);
  if (pEVar3 == (Entry *)0x0) {
    uVar1 = *(uint *)(*(long *)(*(long *)(DAT_00b521b0 + 0x60) + (long)(int)term->_functor * 8) +
                     0x20);
    uVar7 = (ulong)uVar1;
    local_68 = uVar7;
    local_60 = uVar7;
    if (uVar7 == 0) {
      local_58 = (uint *)0x0;
      __s = (uint *)0x0;
    }
    else {
      uVar10 = uVar7 * 4 + 0xf & 0x7fffffff0;
      if (uVar10 == 0) {
        __s = (uint *)Lib::FixedSizeAllocator<8UL>::alloc
                                ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
      }
      else if (uVar10 < 0x11) {
        __s = (uint *)Lib::FixedSizeAllocator<16UL>::alloc
                                ((FixedSizeAllocator<16UL> *)
                                 (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      }
      else if (uVar10 < 0x19) {
        __s = (uint *)Lib::FixedSizeAllocator<24UL>::alloc
                                ((FixedSizeAllocator<24UL> *)
                                 (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
      }
      else if (uVar10 < 0x21) {
        __s = (uint *)Lib::FixedSizeAllocator<32UL>::alloc
                                ((FixedSizeAllocator<32UL> *)
                                 (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
      }
      else if (uVar10 < 0x31) {
        __s = (uint *)Lib::FixedSizeAllocator<48UL>::alloc
                                ((FixedSizeAllocator<48UL> *)
                                 (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
      }
      else if (uVar10 < 0x41) {
        __s = (uint *)Lib::FixedSizeAllocator<64UL>::alloc
                                ((FixedSizeAllocator<64UL> *)
                                 (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
      }
      else {
        __s = (uint *)::operator_new(uVar10,0x10);
      }
      lVar12 = 0;
      memset(__s,0,uVar7 * 4);
      puVar9 = __s;
      local_58 = __s;
      do {
        uVar2 = evaluateGroundTerm(this,(Term *)term->_args
                                                [(int)((*(uint *)&term->field_0xc & 0xfffffff) +
                                                      (int)lVar12)]._content);
        *puVar9 = uVar2;
        if (uVar2 == 0) {
          puVar8 = (undefined8 *)__cxa_allocate_exception(0x50);
          Kernel::Term::toString_abi_cxx11_(&local_88,term,true);
          std::operator+(&local_50,"Could not evaluate ",&local_88);
          *puVar8 = &PTR_cry_00b3dfc0;
          puVar8[1] = puVar8 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar8 + 1),local_50._M_dataplus._M_p,
                     local_50._M_dataplus._M_p + local_50._M_string_length);
          *puVar8 = &PTR_cry_00b3e0a8;
          *(undefined4 *)(puVar8 + 5) = 0;
          puVar8[6] = puVar8 + 8;
          puVar8[7] = 0;
          *(undefined1 *)(puVar8 + 8) = 0;
          __cxa_throw(puVar8,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        puVar9 = puVar9 + 1;
        lVar12 = lVar12 + -1;
      } while (-lVar12 != uVar7);
    }
    pOVar5 = Kernel::Signature::Symbol::fnType
                       (*(Symbol **)(*(long *)(DAT_00b521b0 + 0x60) + (ulong)term->_functor * 8));
    uVar10 = (ulong)(this->_f_offsets)._array[term->_functor];
    if (uVar7 == 0) {
      uVar1 = (this->_f_interpretation)._array[uVar10];
      if (__s == (uint *)0x0) {
        return uVar1;
      }
    }
    else {
      iVar11 = 1;
      lVar12 = 0;
      do {
        uVar2 = __s[lVar12];
        if ((uint)lVar12 < pOVar5->_typeArgsArity) {
          TVar6 = Kernel::AtomicSort::superSort();
        }
        else {
          TVar6._content =
               *(uint64_t *)(pOVar5->_key + (ulong)((uint)lVar12 - pOVar5->_typeArgsArity) * 8 + 8);
        }
        uVar10 = (ulong)((int)uVar10 + (uVar2 - 1) * iVar11);
        iVar11 = iVar11 * (this->_sizes)._array[*(uint *)(TVar6._content + 8)];
        lVar12 = lVar12 + 1;
      } while ((uint)lVar12 < uVar1);
      uVar1 = (this->_f_interpretation)._array[uVar10];
      uVar7 = uVar7 * 4 + 0xf & 0x7fffffff0;
      if (uVar7 != 0) {
        if (uVar7 < 0x11) {
          *(undefined8 *)__s = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = __s;
          return uVar1;
        }
        if (uVar7 < 0x19) {
          *(undefined8 *)__s = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = __s;
          return uVar1;
        }
        if (uVar7 < 0x21) {
          *(undefined8 *)__s = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = __s;
          return uVar1;
        }
        if (uVar7 < 0x31) {
          *(undefined8 *)__s = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = __s;
          return uVar1;
        }
        if (uVar7 < 0x41) {
          *(undefined8 *)__s = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = __s;
          return uVar1;
        }
        operator_delete(__s,0x10);
        return uVar1;
      }
    }
    *(undefined8 *)__s = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = __s;
  }
  else {
    pVar4 = getDomainConstant(this,term);
    uVar1 = pVar4.first;
  }
  return uVar1;
}

Assistant:

unsigned FiniteModelMultiSorted::evaluateGroundTerm(Term* term)
{
  ASS(term->ground());

#if DEBUG_MODEL
  cout << "evaluating ground term " << term->toString() << endl;
  cout << "domain constant status " << isDomainConstant(term) << endl;
#endif
  if(isDomainConstant(term)) return getDomainConstant(term).first;

  unsigned arity = env.signature->functionArity(term->functor());
  DArray<unsigned> args(arity);
  for(unsigned i=0;i<arity;i++){
    args[i] = evaluateGroundTerm(term->nthArgument(i)->term());
    if(args[i]==0) USER_ERROR("Could not evaluate "+term->toString());
  }

  OperatorType* sig = env.signature->getFunction(term->functor())->fnType();
  unsigned var = _f_offsets[term->functor()];
  unsigned mult = 1;
  for(unsigned i=0;i<args.size();i++){
    var += mult*(args[i]-1);
    unsigned s = sig->arg(i).term()->functor();
    mult *=_sizes[s];
  }
#if VDEBUG
  if((term->functor()+1)<_f_offsets.size()) ASS_L(var,_f_offsets[term->functor()+1]);
#endif
  ASS_L(var,_f_interpretation.size());

  return _f_interpretation[var];
}